

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

OutPt * ClipperLib::GetBottomPt(OutPt *pp)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  OutPt *pOVar4;
  OutPt *pOVar5;
  OutPt *btmPt2;
  
LAB_0058dfc8:
  do {
    pOVar4 = pp;
    pp = pOVar4;
    btmPt2 = (OutPt *)0x0;
    while( true ) {
      do {
        do {
          pp = pp->next;
          if (pp == pOVar4) {
            pOVar5 = pOVar4;
            if (btmPt2 != (OutPt *)0x0) {
              while (btmPt2 != pOVar4) {
                bVar3 = FirstIsBottomPt(pp,btmPt2);
                if (!bVar3) {
                  pOVar5 = btmPt2;
                }
                do {
                  do {
                    btmPt2 = btmPt2->next;
                  } while ((btmPt2->pt).X != (pOVar5->pt).X);
                } while ((btmPt2->pt).Y != (pOVar5->pt).Y);
              }
            }
            return pOVar5;
          }
          lVar1 = (pOVar4->pt).Y;
          lVar2 = (pp->pt).Y;
          if (lVar1 < lVar2) goto LAB_0058dfc8;
        } while (lVar2 != lVar1);
        lVar1 = (pOVar4->pt).X;
        lVar2 = (pp->pt).X;
      } while (lVar1 < lVar2);
      if (lVar2 < lVar1) break;
      if ((pp->next != pOVar4) && (pp->prev != pOVar4)) {
        btmPt2 = pp;
      }
    }
  } while( true );
}

Assistant:

OutPt* GetBottomPt(OutPt *pp)
{
  OutPt* dups = 0;
  OutPt* p = pp->next;
  while (p != pp)
  {
    if (p->pt.Y > pp->pt.Y)
    {
      pp = p;
      dups = 0;
    }
    else if (p->pt.Y == pp->pt.Y && p->pt.X <= pp->pt.X)
    {
      if (p->pt.X < pp->pt.X)
      {
        dups = 0;
        pp = p;
      } else
      {
        if (p->next != pp && p->prev != pp) dups = p;
      }
    }
    p = p->next;
  }
  if (dups)
  {
    //there appears to be at least 2 vertices at bottomPt so ...
    while (dups != p)
    {
      if (!FirstIsBottomPt(p, dups)) pp = dups;
      dups = dups->next;
      while (!PointsEqual(dups->pt, pp->pt)) dups = dups->next;
    }
  }
  return pp;
}